

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void save(LexState *ls,int c)

{
  Mbuffer *pMVar1;
  size_t sVar2;
  char *local_30;
  size_t newsize;
  Mbuffer *b;
  int c_local;
  LexState *ls_local;
  
  pMVar1 = ls->buff;
  if (pMVar1->buffsize < pMVar1->n + 1) {
    if (0x7ffffffffffffffd < pMVar1->buffsize) {
      luaX_lexerror(ls,"lexical element too long",0);
    }
    sVar2 = pMVar1->buffsize * 2;
    if (sVar2 + 1 < 0xfffffffffffffffe) {
      local_30 = (char *)luaM_realloc_(ls->L,pMVar1->buffer,pMVar1->buffsize,sVar2);
    }
    else {
      local_30 = (char *)luaM_toobig(ls->L);
    }
    pMVar1->buffer = local_30;
    pMVar1->buffsize = sVar2;
  }
  sVar2 = pMVar1->n;
  pMVar1->n = sVar2 + 1;
  pMVar1->buffer[sVar2] = (char)c;
  return;
}

Assistant:

static void save(LexState*ls,int c){
Mbuffer*b=ls->buff;
if(b->n+1>b->buffsize){
size_t newsize;
if(b->buffsize>=((size_t)(~(size_t)0)-2)/2)
luaX_lexerror(ls,"lexical element too long",0);
newsize=b->buffsize*2;
luaZ_resizebuffer(ls->L,b,newsize);
}
b->buffer[b->n++]=cast(char,c);
}